

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domains.c
# Opt level: O0

double * append_domain_coords_face
                   (int dom,int order,double *ptr,int *global_index,int *edges,int *tri,int ntri)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  double *pdVar3;
  double *in_RDX;
  int in_ESI;
  uint in_EDI;
  long in_R8;
  long in_R9;
  double dVar4;
  double dVar5;
  int in_stack_00000008;
  int edge;
  double travel;
  double yoffset;
  double xoffset;
  double pt [2];
  int v1;
  int v0;
  int j;
  int i;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  int local_30;
  int local_2c;
  double *local_10;
  
  local_50 = 0.0;
  local_58 = 0.0;
  local_10 = in_RDX;
  if (in_ESI == 3) {
    for (local_2c = 0; local_2c < in_stack_00000008; local_2c = local_2c + 1) {
      local_40 = 0.0;
      local_48 = 0.0;
      for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
        iVar1 = *(int *)(in_R9 + (long)(local_2c * 3 + local_30) * 4);
        iVar2 = *(int *)(in_RCX + (long)*(int *)(in_R8 + (long)(iVar1 << 1) * 4) * 4);
        iVar1 = *(int *)(in_RCX + (long)*(int *)(in_R8 + (long)(iVar1 * 2 + 1) * 4) * 4);
        local_48 = global_coords[iVar1 << 1] + global_coords[iVar2 << 1] + local_48;
        local_40 = global_coords[iVar1 * 2 + 1] + global_coords[iVar2 * 2 + 1] + local_40;
      }
      switch(local_2c % 4) {
      case 0:
        local_50 = -0.01;
        local_58 = 0.0;
        break;
      case 1:
        local_50 = 0.0;
        local_58 = -0.01;
        break;
      case 2:
        local_50 = 0.01;
        local_58 = 0.0;
        break;
      case 3:
        local_50 = 0.0;
        local_58 = 0.01;
      }
      dVar4 = local_50 + local_48 / 6.0;
      dVar5 = local_58 + local_40 / 6.0;
      pdVar3 = local_10 + 1;
      *local_10 = dVar4;
      local_10 = local_10 + 2;
      *pdVar3 = dVar5;
      printf("%lg %lg 0. %d\n",dVar4,dVar5,(ulong)in_EDI);
    }
  }
  return local_10;
}

Assistant:

double *
append_domain_coords_face(int dom, int order, double *ptr,
                          const int *global_index,
                          const int *edges, const int *tri, int ntri) {
  int i,j,v0,v1;
  double pt[2], xoffset = 0., yoffset = 0., travel = 0.01;
  if(order == 3) {
    for(i = 0; i < ntri; ++i) {
      pt[0] = pt[1] = 0.;
      for(j = 0; j < 3; ++j) {
        /* Current edge in tri*/
        int edge = tri[3*i+j];

        /* vertex indices of edge endpoints */
        v0 = global_index[edges[2*edge]];
        v1 = global_index[edges[2*edge+1]];

        pt[0] += global_coords[v0*2+0];
        pt[1] += global_coords[v0*2+1];
        pt[0] += global_coords[v1*2+0];
        pt[1] += global_coords[v1*2+1];
      }
      /* triangle center. */
      pt[0] /= 6.;
      pt[1] /= 6.;

      switch(i%4) {
      case 0: xoffset = -travel; yoffset = 0.;      break;
      case 1: xoffset = 0.;      yoffset = -travel; break;
      case 2: xoffset = travel;  yoffset = 0.;      break;
      case 3: xoffset = 0.;      yoffset = travel;  break;
      }

      /* perturb the point. */
      pt[0] += xoffset;
      pt[1] += yoffset;

      *ptr++ = pt[0];
      *ptr++ = pt[1];

      /* Print value to Point3D output. */
      printf("%lg %lg 0. %d\n", pt[0],pt[1], dom);
    }
  }
  return ptr;
}